

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapRead.c
# Opt level: O2

Amap_Lib_t * Amap_ParseTokens(Vec_Ptr_t *vTokens,int fVerbose)

{
  Vec_Ptr_t *p;
  int iVar1;
  int iVar2;
  int iVar3;
  Amap_Lib_t *p_00;
  char *pcVar4;
  Amap_Gat_t *p_01;
  Amap_Lib_t *pAVar5;
  Amap_Gat_t *pAVar6;
  void *pvVar7;
  undefined4 uVar8;
  void *pvVar9;
  uint uVar10;
  long lVar11;
  char *pcVar12;
  int iVar13;
  long lVar14;
  double dVar15;
  uint *puVar16;
  
  p_00 = Amap_LibAlloc();
  pcVar4 = (char *)Vec_PtrEntry(vTokens,0);
  iVar2 = 1;
  do {
    iVar1 = strcmp(pcVar4,"GATE");
    if (iVar1 != 0) {
      Amap_LibFree(p_00);
      pcVar12 = "The first line should begin with %s.\n";
      pcVar4 = "GATE";
LAB_0035236a:
      printf(pcVar12,pcVar4);
      return (Amap_Lib_t *)0x0;
    }
    iVar1 = Amap_ParseCountPins(vTokens,iVar2);
    p_01 = Amap_ParseGateAlloc(p_00->pMemGates,iVar1);
    pAVar6 = p_01 + 1;
    p_01->pLib = (Amap_Lib_t *)0x0;
    p_01->pTwin = (Amap_Gat_t *)0x0;
    p_01->pName = (char *)0x0;
    p_01->pOutName = (char *)0x0;
    p_01->dArea = 0.0;
    p_01->pForm = (char *)0x0;
    p_01->pFunc = (uint *)0x0;
    *(undefined8 *)&p_01->field_0x38 = 0;
    *(uint *)&p_01->field_0x38 = p_00->vGates->nSize & 0x7fffff;
    Vec_PtrPush(p_00->vGates,p_01);
    p_01->pLib = p_00;
    p_01->field_0x3b = (char)iVar1;
    pcVar4 = (char *)Vec_PtrEntry(vTokens,iVar2);
    pcVar4 = Amap_ParseStrsav(p_00->pMemGates,pcVar4);
    p_01->pName = pcVar4;
    pcVar4 = (char *)Vec_PtrEntry(vTokens,iVar2 + 1);
    dVar15 = atof(pcVar4);
    p_01->dArea = dVar15;
    pcVar4 = (char *)Vec_PtrEntry(vTokens,iVar2 + 2);
    pcVar4 = Amap_ParseStrsav(p_00->pMemGates,pcVar4);
    p_01->pOutName = pcVar4;
    pcVar4 = (char *)Vec_PtrEntry(vTokens,iVar2 + 3);
    iVar2 = Amap_CollectFormulaTokens(vTokens,pcVar4,iVar2 + 4);
    pcVar4 = Amap_ParseStrsav(p_00->pMemGates,pcVar4);
    p_01->pForm = pcVar4;
    lVar11 = 0;
    lVar14 = 0;
    while( true ) {
      iVar1 = (int)lVar14;
      iVar13 = iVar2 + iVar1;
      if ((ulong)(byte)p_01->field_0x3b * 0x48 + (long)pAVar6 <=
          (ulong)((long)&pAVar6->pLib + lVar11)) break;
      pcVar4 = (char *)Vec_PtrEntry(vTokens,iVar13);
      iVar3 = strcmp(pcVar4,"PIN");
      if (iVar3 != 0) {
        Amap_LibFree(p_00);
        pcVar4 = p_01->pName;
        pcVar12 = "Cannot parse gate %s.\n";
        goto LAB_0035236a;
      }
      pcVar4 = (char *)Vec_PtrEntry(vTokens,iVar13 + 1);
      pAVar5 = (Amap_Lib_t *)Amap_ParseStrsav(p_00->pMemGates,pcVar4);
      (&pAVar6->pLib)[lVar14] = pAVar5;
      pcVar4 = (char *)Vec_PtrEntry(vTokens,iVar13 + 2);
      iVar13 = strcmp(pcVar4,"UNKNOWN");
      if (iVar13 == 0) {
        uVar8 = 0;
      }
      else {
        iVar13 = strcmp(pcVar4,"INV");
        uVar8 = 1;
        if (iVar13 != 0) {
          iVar13 = strcmp(pcVar4,"NONINV");
          uVar8 = 2;
          if (iVar13 != 0) {
            Amap_LibFree(p_00);
            printf("Cannot read phase of pin %s of gate %s\n",(&p_01[1].pLib)[lVar14],p_01->pName);
            return (Amap_Lib_t *)0x0;
          }
        }
      }
      *(undefined4 *)(&p_01[1].pTwin + lVar14) = uVar8;
      pcVar4 = (char *)Vec_PtrEntry(vTokens,iVar2 + iVar1 + 3);
      pcVar4 = (char *)atof(pcVar4);
      (&p_01[1].pName)[lVar14] = pcVar4;
      pcVar4 = (char *)Vec_PtrEntry(vTokens,iVar2 + iVar1 + 4);
      pcVar4 = (char *)atof(pcVar4);
      (&p_01[1].pOutName)[lVar14] = pcVar4;
      pcVar4 = (char *)Vec_PtrEntry(vTokens,iVar2 + iVar1 + 5);
      dVar15 = atof(pcVar4);
      (&p_01[1].dArea)[lVar14] = dVar15;
      pcVar4 = (char *)Vec_PtrEntry(vTokens,iVar2 + iVar1 + 6);
      pcVar4 = (char *)atof(pcVar4);
      (&p_01[1].pForm)[lVar14] = pcVar4;
      pcVar4 = (char *)Vec_PtrEntry(vTokens,iVar2 + iVar1 + 7);
      puVar16 = (uint *)atof(pcVar4);
      (&p_01[1].pFunc)[lVar14] = puVar16;
      pcVar4 = (char *)Vec_PtrEntry(vTokens,iVar2 + iVar1 + 8);
      dVar15 = atof(pcVar4);
      *(double *)(&p_01[1].field_0x38 + lVar14 * 8) = dVar15;
      pAVar5 = (Amap_Lib_t *)(&p_01[1].dArea)[lVar14];
      if ((&p_01[1].dArea)[lVar14] <= (double)(&p_01[1].pFunc)[lVar14]) {
        pAVar5 = (Amap_Lib_t *)(&p_01[1].pFunc)[lVar14];
      }
      (&p_01[2].pLib)[lVar14] = pAVar5;
      lVar14 = lVar14 + 9;
      lVar11 = lVar11 + 0x48;
    }
    if (((p_01->field_0x3b == 1) && (*(char *)&pAVar6->pLib->pName == '*')) &&
       (*(char *)((long)&pAVar6->pLib->pName + 1) == '\0')) {
      pAVar6 = Amap_ParseGateWithSamePins(p_01);
      p = p_00->vGates;
      if (p->nSize < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x2cc,"void *Vec_PtrPop(Vec_Ptr_t *)");
      }
      p->nSize = p->nSize + -1;
      Vec_PtrPush(p,pAVar6);
    }
    iVar2 = iVar2 + iVar1 + 1;
    pcVar4 = (char *)Vec_PtrEntry(vTokens,iVar13);
    iVar1 = strcmp(pcVar4,".end");
    if (iVar1 == 0) {
      pcVar4 = (char *)0x0;
      uVar10 = 0;
      pvVar9 = (void *)0x0;
      for (iVar2 = 0; iVar2 < p_00->vGates->nSize; iVar2 = iVar2 + 1) {
        pvVar7 = Vec_PtrEntry(p_00->vGates,iVar2);
        if (pvVar9 != (void *)0x0) {
          pcVar12 = *(char **)((long)pvVar7 + 0x10);
          iVar1 = strcmp(*(char **)((long)pvVar9 + 0x10),pcVar12);
          if (iVar1 == 0) {
            *(void **)((long)pvVar9 + 8) = pvVar7;
            *(void **)((long)pvVar7 + 8) = pvVar9;
            if (pcVar4 == (char *)0x0) {
              pcVar4 = pcVar12;
            }
            uVar10 = uVar10 + 1;
          }
        }
        pvVar9 = pvVar7;
      }
      if (uVar10 != 0) {
        printf("Warning: Detected %d multi-output gates (for example, \"%s\").\n",(ulong)uVar10,
               pcVar4);
      }
      return p_00;
    }
  } while( true );
}

Assistant:

Amap_Lib_t * Amap_ParseTokens( Vec_Ptr_t * vTokens, int fVerbose )
{
    Amap_Lib_t * p;
    Amap_Gat_t * pGate, * pPrev;
    Amap_Pin_t * pPin;
    char * pToken, * pMoGate = NULL;
    int i, nPins, iPos = 0, Count = 0;
    p = Amap_LibAlloc();
    pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
    do 
    {
        if ( strcmp( pToken, AMAP_STRING_GATE ) )
        {
            Amap_LibFree( p );
            printf( "The first line should begin with %s.\n", AMAP_STRING_GATE );
            return NULL;
        }
        // start gate
        nPins = Amap_ParseCountPins( vTokens, iPos );
        pGate = Amap_ParseGateAlloc( p->pMemGates, nPins );
        memset( pGate, 0, sizeof(Amap_Gat_t) );
        pGate->Id = Vec_PtrSize( p->vGates );
        Vec_PtrPush( p->vGates, pGate );
        pGate->pLib = p;
        pGate->nPins = nPins;
        // read gate
        pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
        pGate->pName = Amap_ParseStrsav( p->pMemGates, pToken );    
        pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
        pGate->dArea = atof( pToken );
        pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
        pGate->pOutName = Amap_ParseStrsav( p->pMemGates, pToken ); 
        pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
        iPos = Amap_CollectFormulaTokens( vTokens, pToken, iPos );
        pGate->pForm = Amap_ParseStrsav( p->pMemGates, pToken ); 
        // read pins
        Amap_GateForEachPin( pGate, pPin )
        {
            pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
            if ( strcmp( pToken, AMAP_STRING_PIN ) )
            {
                Amap_LibFree( p );
                printf( "Cannot parse gate %s.\n", pGate->pName );
                return NULL;
            }
            // read pin
            pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
            pPin->pName = Amap_ParseStrsav( p->pMemGates, pToken );   
            pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
            if ( strcmp( pToken, AMAP_STRING_UNKNOWN ) == 0 )
                pPin->Phase = AMAP_PHASE_UNKNOWN;
            else if ( strcmp( pToken, AMAP_STRING_INV ) == 0 )
                pPin->Phase = AMAP_PHASE_INV;
            else if ( strcmp( pToken, AMAP_STRING_NONINV ) == 0 )
                pPin->Phase = AMAP_PHASE_NONINV;
            else 
            {
                Amap_LibFree( p );
                printf( "Cannot read phase of pin %s of gate %s\n", pPin->pName, pGate->pName );
                return NULL;
            }
            pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
            pPin->dLoadInput = atof( pToken );
            pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
            pPin->dLoadMax = atof( pToken );
            pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
            pPin->dDelayBlockRise = atof( pToken );
            pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
            pPin->dDelayFanoutRise = atof( pToken );
            pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
            pPin->dDelayBlockFall = atof( pToken );
            pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
            pPin->dDelayFanoutFall = atof( pToken );
            if ( pPin->dDelayBlockRise > pPin->dDelayBlockFall )
                pPin->dDelayBlockMax = pPin->dDelayBlockRise;
            else
                pPin->dDelayBlockMax = pPin->dDelayBlockFall;
        }
        // fix the situation when all pins are represented as one
        if ( pGate->nPins == 1 && !strcmp( pGate->Pins->pName, "*" ) )
        {
            pGate = Amap_ParseGateWithSamePins( pGate );
            Vec_PtrPop( p->vGates );
            Vec_PtrPush( p->vGates, pGate );
        }
        pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
//printf( "Finished reading gate %s (%s)\n", pGate->pName, pGate->pOutName );
    }
    while ( strcmp( pToken, ".end" ) );

    // check if there are gates with identical names
    pPrev = NULL;
    Amap_LibForEachGate( p, pGate, i )
    {
        if ( pPrev && !strcmp(pPrev->pName, pGate->pName) )
        {
            pPrev->pTwin = pGate, pGate->pTwin = pPrev;
//            printf( "Warning: Detected multi-output gate \"%s\".\n", pGate->pName );
            if ( pMoGate == NULL )
                pMoGate = pGate->pName;
            Count++;
        }
        pPrev = pGate;
    }
    if ( Count )
        printf( "Warning: Detected %d multi-output gates (for example, \"%s\").\n", Count, pMoGate );
    return p;
}